

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# components.hpp
# Opt level: O2

void __thiscall
cs::stack_type<cs::method_base_*,_std::allocator>::destroy
          (stack_type<cs::method_base_*,_std::allocator> *this)

{
  method_base **ppmVar1;
  
  ppmVar1 = this->m_current;
  while (ppmVar1 != this->m_start) {
    ppmVar1 = ppmVar1 + -1;
    this->m_current = ppmVar1;
  }
  operator_delete(this->m_data,this->m_size << 3);
  return;
}

Assistant:

void destroy()
		{
			while (m_current != m_start)
				(--m_current)->~T();
			m_alloc.deallocate(m_data, m_size);
		}